

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainerSGD.cpp
# Opt level: O0

DNN_NUMERIC __thiscall tfs::DnnTrainerSGD::adjustWeights(DnnTrainerSGD *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  double *pdVar7;
  double *pdVar8;
  undefined8 *puVar9;
  long in_RDI;
  double dVar10;
  undefined1 auVar11 [16];
  DNN_NUMERIC dx;
  DNN_NUMERIC gij;
  DNN_NUMERIC l2grad;
  DNN_NUMERIC l1grad;
  DNN_NUMERIC ww;
  DNN_NUMERIC l2_decay;
  DNN_NUMERIC l1_decay;
  DNN_NUMERIC *gradientEnd;
  DNN_NUMERIC *gradient;
  DNN_NUMERIC *weightEnd;
  DNN_NUMERIC *weight;
  Trainable *trainable;
  Trainable **trainableEnd;
  Trainable **trainableHandle;
  DNN_NUMERIC *gsum;
  undefined8 in_stack_ffffffffffffffa8;
  DnnTrainer *in_stack_ffffffffffffffb0;
  double *local_48;
  double *local_38;
  undefined8 *local_20;
  double *local_18;
  
  local_18 = (double *)0x0;
  if (0.0 < *(double *)(in_RDI + 0x28)) {
    if (*(long *)(in_RDI + 0x70) == 0) {
      DnnTrainer::setupSums
                (in_stack_ffffffffffffffb0,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    }
    local_18 = TMatrix<double>::data(*(TMatrix<double> **)(in_RDI + 0x70));
  }
  puVar6 = *(undefined8 **)(in_RDI + 0x50);
  local_20 = *(undefined8 **)(in_RDI + 0x48);
  while( true ) {
    if (puVar6 <= local_20) {
      return *(DNN_NUMERIC *)(in_RDI + 0x30);
    }
    puVar9 = local_20 + 1;
    local_20 = (undefined8 *)*local_20;
    local_38 = (double *)*local_20;
    pdVar7 = (double *)local_20[1];
    local_48 = (double *)local_20[2];
    pdVar8 = (double *)local_20[3];
    dVar1 = *(double *)(in_RDI + 0x18);
    dVar2 = (double)local_20[4];
    dVar3 = *(double *)(in_RDI + 0x20);
    dVar4 = (double)local_20[5];
    if ((local_38 == (double *)0x0) || (local_48 == (double *)0x0)) break;
    while (local_20 = puVar9, local_38 < pdVar7) {
      uVar5 = *(undefined8 *)(in_RDI + 0x38);
      auVar11._8_4_ = (int)((ulong)uVar5 >> 0x20);
      auVar11._0_8_ = uVar5;
      auVar11._12_4_ = 0x45300000;
      dVar10 = (dVar1 * dVar2 * *(double *)(&DAT_0012e6f0 + (ulong)(0.0 < *local_38) * 8) +
                dVar3 * dVar4 * *local_38 + *local_48) /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      if (pdVar8 <= local_48) {
        report_problem("Error",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainerSGD.cpp"
                       ,"adjustWeights",0x38,
                       "Trainable has gradient[] smaller than weight[] in size.");
        return *(DNN_NUMERIC *)(in_RDI + 0x30);
      }
      if ((*(double *)(in_RDI + 0x28) <= 0.0) || (local_18 == (double *)0x0)) {
        *local_38 = -*(double *)(in_RDI + 0x10) * dVar10 + *local_38;
      }
      else {
        dVar10 = *(double *)(in_RDI + 0x28) * *local_18 + -(*(double *)(in_RDI + 0x10) * dVar10);
        *local_18 = dVar10;
        *local_38 = dVar10 + *local_38;
        local_18 = local_18 + 1;
      }
      local_38 = local_38 + 1;
      *local_48 = 0.0;
      local_48 = local_48 + 1;
    }
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainerSGD.cpp"
                 ,"adjustWeights",0x2c,"Trainable has weight or gradient == 0");
  return *(DNN_NUMERIC *)(in_RDI + 0x30);
}

Assistant:

DNN_NUMERIC
    DnnTrainerSGD::adjustWeights( void ) {
        DNN_NUMERIC *gsum = 0;
        if( m_momentum > 0.0 ) {
            if( m_gsum == 0 ) {
                setupSums( false );  // setup only gsum[]
            }
            gsum = m_gsum->data();
        }
        
        Trainable **trainableHandle = m_trainable_handle;
        Trainable **trainableEnd    = m_trainable_end;
        
        while( trainableHandle < trainableEnd ) {
                  Trainable   *trainable   = *trainableHandle++;      // trainable != 0 & ok() from DnnTrainer::setUpTrainables()
                  DNN_NUMERIC *weight      = trainable->weightStart;
            const DNN_NUMERIC *weightEnd   = trainable->weightEnd;
                  DNN_NUMERIC *gradient    = trainable->gradientStart;
            const DNN_NUMERIC *gradientEnd = trainable->gradientEnd;
            const DNN_NUMERIC l1_decay     = m_l1_decay * trainable->l1_decay_mul;
            const DNN_NUMERIC l2_decay     = m_l2_decay * trainable->l2_decay_mul;
            
            if( weight == 0 || gradient == 0 ) {
                log_error( "Trainable has weight or gradient == 0" );
                return m_loss;
            }
            
            while( weight < weightEnd ) {
                const DNN_NUMERIC     ww = *weight;
                const DNN_NUMERIC l1grad = l1_decay * (ww > 0.0 ? 1.0 : -1.0);
                const DNN_NUMERIC l2grad = l2_decay * ww;
                
                const DNN_NUMERIC gij = ( l1grad + l2grad + *gradient ) / m_batch_size; // raw batch gradient
                
                if( gradient >= gradientEnd ) {
                    log_error( "Trainable has gradient[] smaller than weight[] in size." );
                    return m_loss;
                }
                if( m_momentum > 0.0 && gsum != 0 ) {
                    const DNN_NUMERIC dx = m_momentum * *gsum - m_learning_rate * gij;
                    *gsum++    = dx;    // Save next momentum iteration
                    *weight++ += dx;    // apply corrected gradient
                } else {
                    *weight++ -= m_learning_rate * gij;
                }
                *gradient++ = 0.0;
            }
        }
        return m_loss;
    }